

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

void __thiscall amrex::VisMF::Header::Header(Header *this)

{
  undefined4 *in_RDI;
  BoxArray *this_00;
  
  *in_RDI = 0;
  IntVect::IntVect((IntVect *)(in_RDI + 3));
  this_00 = (BoxArray *)(in_RDI + 6);
  BoxArray::BoxArray(this_00);
  Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>::Vector
            ((Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_> *)0x121b488)
  ;
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ::Vector((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
            *)0x121b49e);
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ::Vector((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
            *)0x121b4b4);
  Vector<double,_std::allocator<double>_>::Vector
            ((Vector<double,_std::allocator<double>_> *)0x121b4ca);
  Vector<double,_std::allocator<double>_>::Vector
            ((Vector<double,_std::allocator<double>_> *)0x121b4e0);
  RealDescriptor::RealDescriptor((RealDescriptor *)this_00);
  return;
}

Assistant:

VisMF::Header::Header ()
    :
    m_vers(VisMF::Header::Undefined_v1)
{}